

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O2

wchar_t adjust_dam(player *p,wchar_t type,wchar_t dam,_Bool actual)

{
  short sVar1;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  int iVar6;
  uint32_t uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  
  iVar8 = 0;
LAB_001bae98:
  iVar9 = 0;
  uVar10 = (ulong)(uint)dam;
  wVar3 = type;
switchD_001baece_caseD_e:
  wVar4 = wVar3;
  if (p == (player *)0x0) {
    iVar9 = 0;
    wVar5 = dam;
    wVar4 = type;
    goto LAB_001bb040;
  }
  wVar5 = (wchar_t)uVar10;
  if (p->race != (player_race *)0x0) goto code_r0x001baec4;
  iVar11 = 100;
  goto LAB_001bb00a;
switchD_001baece_caseD_15:
  dam = wVar5 / 2;
  wVar3 = adjust_dam(p,L'\x02',dam,actual);
  iVar8 = iVar9 + iVar8 + wVar3;
  type = L'\x04';
  goto LAB_001bae98;
code_r0x001baec4:
  wVar3 = L'\x03';
  switch(wVar4) {
  case L'\x0e':
    goto switchD_001baece_caseD_e;
  case L'\x13':
    uVar10 = (long)wVar5 / 2 & 0xffffffff;
    wVar3 = adjust_dam(p,L'\x02',(wchar_t)((long)wVar5 / 2),actual);
    iVar9 = iVar9 + wVar3;
    wVar3 = L'\x01';
    goto switchD_001baece_caseD_e;
  case L'\x14':
    iVar11 = wVar5 / 2;
    goto LAB_001bb0a2;
  case L'\x15':
    goto switchD_001baece_caseD_15;
  case L'\x16':
    wVar3 = adjust_dam(p,L'\x02',(wVar5 * 2) / 3,actual);
    wVar4 = adjust_dam(p,L'\x06',wVar5 / 3,actual);
    return iVar9 + wVar4 + wVar3 + iVar8;
  }
  if (wVar4 < L'\x1c') {
    sVar1 = (p->state).el_info[wVar4].res_level;
    iVar11 = (int)sVar1;
    if (actual) {
      equip_learn_element(p,wVar4);
    }
    if (sVar1 == 0) {
      iVar11 = 0;
      goto LAB_001bb0a2;
    }
LAB_001bb00a:
    if (wVar4 != L'\0') goto LAB_001bb044;
    _Var2 = minus_ac(p);
    if (_Var2) {
      wVar5 = (wVar5 + L'\x01') / 2;
    }
  }
  else {
LAB_001bb040:
    iVar11 = 100;
LAB_001bb044:
    if ((L'\x03' < wVar4) && (iVar11 < 0x65)) {
      iVar6 = 100 - iVar11;
      if (iVar11 < 0x33) {
        iVar6 = iVar11;
      }
      iVar6 = (iVar6 << (wVar4 == L'\v')) / 10;
      uVar7 = Rand_div(iVar6 * 2 + 1);
      iVar11 = (iVar11 - iVar6) + uVar7;
    }
  }
  iVar11 = (wVar5 * iVar11 + 99) / 100;
LAB_001bb0a2:
  return iVar9 + iVar8 + iVar11;
}

Assistant:

int adjust_dam(struct player *p, int type, int dam, bool actual)
{
	int dam_percent = 100;

	/* If an actual player exists, get their actual resist */
	if (p && p->race) {
		int special_dam = 0;

		/* Handle special cases */
		if (type == PROJ_ICE) {
			return adjust_dam(p, PROJ_COLD, dam, actual);
		} else if (type == PROJ_PLASMA) {
			special_dam = adjust_dam(p, PROJ_FIRE, dam / 2, actual);
			special_dam += adjust_dam(p, PROJ_ELEC, dam / 2, actual);
			return special_dam;
		} else if (type == PROJ_STORM) {
			/* Extra storm damage will come later */
			return dam / 2;
		} else if (type == PROJ_DRAGONFIRE) {
			special_dam = adjust_dam(p, PROJ_FIRE, dam / 2, actual);
			special_dam += adjust_dam(p, PROJ_POIS, dam / 2, actual);
			return special_dam;
		} else if (type == PROJ_HELLFIRE) {
			special_dam = adjust_dam(p, PROJ_FIRE, 2 * dam / 3, actual);
			special_dam += adjust_dam(p, PROJ_DARK, dam / 3, actual);
			return special_dam;
		} else if (type < ELEM_MAX) {
			/* For the regular elements, the stored resistance level is the
			 * percentage of damage taken */
			dam_percent = p->state.el_info[type].res_level;

			/* Notice element stuff */
			if (actual) {
				equip_learn_element(p, type);
			}
		}
	}

	/* Immune */
	if (dam_percent == RES_LEVEL_MAX) return 0;

	/* Acid damage is halved by armour */
	if (type == PROJ_ACID && p && minus_ac(p)) {
		dam = (dam + 1) / 2;
	}

	/* High resists get randomised, especially chaos */
	if ((type >= ELEM_HIGH_MIN) && (dam_percent <= RES_LEVEL_BASE)) {
		/* How far is the closer of zero and 100 */
		int max_range =	dam_percent > 50 ? 100 - dam_percent : dam_percent;

		/* Random range is 1 or 2 times 10% of that range */
		int range = (((type == PROJ_CHAOS) ? 2 : 1) * max_range) / 10;

		/* Randomize */
		dam_percent = dam_percent - range + randint0((2 * range) + 1);
	}

	/* Apply the percentage resistance, rounded up */
	return ((dam * dam_percent) + 99) / 100;
}